

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

ScriptPtr * FBehavior::StaticFindScript(int script,FBehavior **module)

{
  uint uVar1;
  FBehavior **ppFVar2;
  ScriptPtr *pSVar3;
  ScriptPtr *code;
  DWORD i;
  FBehavior **module_local;
  int script_local;
  
  code._4_4_ = 0;
  while( true ) {
    uVar1 = TArray<FBehavior_*,_FBehavior_*>::Size(&StaticModules);
    if (uVar1 <= code._4_4_) {
      return (ScriptPtr *)0x0;
    }
    ppFVar2 = TArray<FBehavior_*,_FBehavior_*>::operator[](&StaticModules,(ulong)code._4_4_);
    pSVar3 = FindScript(*ppFVar2,script);
    if (pSVar3 != (ScriptPtr *)0x0) break;
    code._4_4_ = code._4_4_ + 1;
  }
  ppFVar2 = TArray<FBehavior_*,_FBehavior_*>::operator[](&StaticModules,(ulong)code._4_4_);
  *module = *ppFVar2;
  return pSVar3;
}

Assistant:

const ScriptPtr *FBehavior::StaticFindScript (int script, FBehavior *&module)
{
	for (DWORD i = 0; i < StaticModules.Size(); ++i)
	{
		const ScriptPtr *code = StaticModules[i]->FindScript (script);
		if (code != NULL)
		{
			module = StaticModules[i];
			return code;
		}
	}
	return NULL;
}